

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_1_funcall(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_FUNCALL,G->val[-2],G->val[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_funcall(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define a G->val[-1]
#define i G->val[-2]
  yyprintf((stderr, "do yy_1_funcall"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_FUNCALL, i, a);\n\
    }\n"));
  
        yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_FUNCALL, i, a);
    ;
#undef a
#undef i
}